

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O1

bool google::protobuf::util::ParseDelimitedFromCodedStream
               (MessageLite *message,CodedInputStream *input,bool *clean_eof)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  bool bVar8;
  Limit limit;
  ulong uVar9;
  uint32_t first_byte_or_zero;
  
  if (clean_eof != (bool *)0x0) {
    *clean_eof = false;
  }
  iVar2 = input->total_bytes_read_;
  pbVar6 = input->buffer_;
  pbVar7 = input->buffer_end_;
  iVar3 = input->buffer_size_after_limit_;
  if (pbVar6 < pbVar7) {
    bVar1 = *pbVar6;
    uVar9 = (ulong)bVar1;
    first_byte_or_zero = (uint32_t)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar6 + 1;
      bVar8 = true;
      goto LAB_01004b76;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  uVar9 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  bVar8 = -1 < (long)uVar9;
LAB_01004b76:
  if (bVar8) {
    iVar2 = *(int *)&input->buffer_end_;
    iVar3 = input->total_bytes_read_;
    iVar4 = *(int *)&input->buffer_;
    iVar5 = input->buffer_size_after_limit_;
    limit = io::CodedInputStream::PushLimit(input,(int)uVar9);
    bVar8 = MessageLite::MergeFromCodedStream(message,input);
    if (((bVar8) && (input->legitimate_message_end_ == true)) &&
       ((((iVar5 - iVar3) + (iVar2 - iVar4) + input->total_bytes_read_) -
        input->buffer_size_after_limit_) + (*(int *)&input->buffer_ - *(int *)&input->buffer_end_)
        == (int)uVar9)) {
      io::CodedInputStream::PopLimit(input,limit);
      return true;
    }
  }
  else if (clean_eof != (bool *)0x0) {
    *clean_eof = (input->total_bytes_read_ - input->buffer_size_after_limit_) +
                 (*(int *)&input->buffer_ - *(int *)&input->buffer_end_) ==
                 (iVar2 - iVar3) + ((int)pbVar6 - (int)pbVar7);
  }
  return false;
}

Assistant:

bool ParseDelimitedFromCodedStream(MessageLite* message,
                                   io::CodedInputStream* input,
                                   bool* clean_eof) {
  if (clean_eof != nullptr) *clean_eof = false;
  int start = input->CurrentPosition();

  // Read the size.
  uint32_t size;
  if (!input->ReadVarint32(&size)) {
    if (clean_eof != nullptr) *clean_eof = input->CurrentPosition() == start;
    return false;
  }

  // Get the position after any size bytes have been read (and only the message
  // itself remains).
  int position_after_size = input->CurrentPosition();

  // Tell the stream not to read beyond that size.
  io::CodedInputStream::Limit limit = input->PushLimit(static_cast<int>(size));

  // Parse the message.
  if (!message->MergeFromCodedStream(input)) return false;
  if (!input->ConsumedEntireMessage()) return false;
  if (input->CurrentPosition() - position_after_size != static_cast<int>(size))
    return false;

  // Release the limit.
  input->PopLimit(limit);

  return true;
}